

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O3

void __thiscall
YAJLHuffmanTable::HFTree::HFTree(HFTree *this,YAJLHuffmanTable *table,bitio_stream *bstream)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  void *pvVar4;
  ssize_t sVar5;
  HFNode *pHVar6;
  HFNode *pHVar7;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int i;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int i_1;
  u8 *var_codes [16];
  int local_cc;
  long alStack_b8 [17];
  
  *(undefined4 *)((long)&this->root + 7) = 0;
  this->root = (HFNode *)0x0;
  if (table != (YAJLHuffmanTable *)0x0) {
    lVar10 = 0;
    do {
      bVar1 = table->ncodes[lVar10];
      pvVar4 = operator_new__((ulong)bVar1);
      alStack_b8[lVar10] = (long)pvVar4;
      if ((ulong)bVar1 != 0) {
        uVar14 = 0;
        __buf = extraout_RDX;
        do {
          sVar5 = bitio::bitio_stream::read(bstream,8,__buf,in_RCX);
          *(char *)((long)pvVar4 + uVar14) = (char)sVar5;
          uVar14 = uVar14 + 1;
          __buf = extraout_RDX_00;
        } while (uVar14 < table->ncodes[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    pHVar6 = (HFNode *)operator_new(0x18);
    pHVar6->left = (HFNode *)0x0;
    pHVar6->right = (HFNode *)0x0;
    pHVar6->symbol = '\0';
    this->root = pHVar6;
    local_cc = 1;
    lVar10 = 0;
    uVar11 = 0;
    do {
      if (table->ncodes[lVar10] != '\0') {
        lVar12 = 0;
        uVar13 = 0;
        do {
          uVar2 = *(u8 *)(alStack_b8[lVar10] + lVar12);
          pHVar6 = this->root;
          iVar8 = local_cc;
          do {
            if (((uVar11 & 0xffff) >> (iVar8 - 1U & 0x1f) & 1) == 0) {
              pHVar7 = pHVar6->left;
              if (pHVar7 == (HFNode *)0x0) goto LAB_001042ff;
            }
            else {
              pHVar7 = pHVar6->right;
              if (pHVar7 == (HFNode *)0x0) {
                pHVar6 = (HFNode *)&pHVar6->right;
LAB_001042ff:
                pHVar7 = (HFNode *)operator_new(0x18);
                pHVar7->left = (HFNode *)0x0;
                pHVar7->right = (HFNode *)0x0;
                pHVar7->symbol = '\0';
                pHVar6->left = pHVar7;
              }
            }
            iVar9 = iVar8 + -1;
            bVar3 = 0 < iVar8;
            pHVar6 = pHVar7;
            iVar8 = iVar9;
          } while (iVar9 != 0 && bVar3);
          if (lVar10 != 0) {
            pHVar7->symbol = uVar2;
          }
          uVar11 = (uVar11 & 0xffff) + 1;
          lVar12 = lVar12 + 1;
          uVar13 = uVar13 + 1;
        } while (uVar13 < table->ncodes[lVar10]);
      }
      uVar11 = uVar11 * 2;
      lVar10 = lVar10 + 1;
      local_cc = local_cc + 1;
    } while (lVar10 != 0x10);
    lVar10 = 0;
    do {
      free((void *)alStack_b8[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
  }
  return;
}

Assistant:

YAJLHuffmanTable::HFTree::HFTree(YAJLHuffmanTable *table, bitio::bitio_stream *bstream) {
    if (table == nullptr) {
        return;
    }



    auto ncodes = table->ncodes;
    u8 *var_codes[16];


    for (int i = 0; i < 16; i++) {
        var_codes[i] = new u8[ncodes[i]];
        for (int j = 0; j < ncodes[i]; j++) {
            var_codes[i][j] = bstream->read(0x8);
        }
    }

    u16 code = 0;
    u32 count = 0;
    root = new HFNode;

    // construct huffman-tree
    for (int i = 0; i < 16; i++) {
        auto in_count = 0;
        for (int j = 0; j < ncodes[i]; j++) {
            insert(code++, i, var_codes[i][in_count]);
            in_count++;
            count++;
        }
        code <<= 1;
    }

    for (int i = 0; i < 0x10; i++) {
        free(var_codes[i]);
    }
}